

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O0

double __thiscall ON_Font::HeightScale(ON_Font *this,double text_height)

{
  ON_FontMetrics *this_00;
  double dVar1;
  double text_height_local;
  ON_Font *this_local;
  
  this_00 = FontMetrics(this);
  dVar1 = ON_FontMetrics::GlyphScale(this_00,text_height);
  return dVar1;
}

Assistant:

double ON_Font::HeightScale(double text_height) const
{
  return FontMetrics().GlyphScale(text_height);
}